

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void line_attempt_2(int x0,int y0,int x1,int y1,TGAImage *image,TGAColor color)

{
  long lVar1;
  float fVar2;
  TGAColor local_30;
  
  local_30.bgra = color.bgra;
  local_30.bytespp = color.bytespp;
  for (lVar1 = 0; x0 + lVar1 <= (long)x1; lVar1 = lVar1 + 1) {
    fVar2 = (float)(int)lVar1 / (float)(x1 - x0);
    TGAImage::set(image,x0 + lVar1,(long)(int)(fVar2 * (float)y1 + (1.0 - fVar2) * (float)y0),
                  &local_30);
  }
  return;
}

Assistant:

void line_attempt_2(int x0, int y0, int x1, int y1, TGAImage &image, TGAColor color)
{
    for (int x = x0; x <= x1; x++) {
        float t = static_cast<float>(x - x0) / static_cast<float>(x1 - x0);
        int y = static_cast<int>(y0 * (1. - t) + static_cast<float>(y1) * t);
        image.set(x, y, color);
    }
}